

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void get_type_alias_name(c2m_ctx_t c2m_ctx,type *type,VARR_char *name)

{
  type_mode tVar1;
  gen_ctx_conflict *pgVar2;
  VARR_node_t *pVVar3;
  anon_union_8_5_3fbb1736_for_u aVar4;
  byte *pbVar5;
  node_code_t nVar6;
  basic_type bVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  decl_spec *pdVar11;
  node_t_conflict *ppnVar12;
  node_t pnVar13;
  char obj;
  ulong uVar14;
  size_t sVar15;
  node_t_conflict param;
  size_t sVar16;
  node_t pnVar17;
  bool bVar18;
  
LAB_001aca8e:
  tVar1 = type->mode;
  switch(tVar1) {
  case TM_BASIC:
    goto switchD_001acaa6_caseD_1;
  case TM_ENUM:
    bVar7 = get_enum_basic_type(type);
    goto LAB_001acbf2;
  case TM_PTR:
    if (name->varr == (char *)0x0) goto LAB_001ad0e5;
    uVar9 = name->els_num + 1;
    if (name->size < uVar9) {
      sVar15 = (uVar9 >> 1) + uVar9;
      pcVar10 = (char *)realloc(name->varr,sVar15);
      name->varr = pcVar10;
      name->size = sVar15;
    }
    sVar16 = name->els_num;
    name->els_num = sVar16 + 1;
    name->varr[sVar16] = 'p';
    type = (type->u).ptr_type;
    goto LAB_001aca8e;
  case TM_STRUCT:
  case TM_UNION:
    if (name->varr == (char *)0x0) goto LAB_001ad113;
    pgVar2 = c2m_ctx->gen_ctx;
    uVar9 = name->els_num + 1;
    if (name->size < uVar9) {
      sVar15 = (uVar9 >> 1) + uVar9;
      pcVar10 = (char *)realloc(name->varr,sVar15);
      name->varr = pcVar10;
      name->size = sVar15;
    }
    sVar16 = name->els_num;
    name->els_num = sVar16 + 1;
    name->varr[sVar16] = (tVar1 != TM_STRUCT) * '\x02' + 'S';
    pVVar3 = pgVar2->node_stack;
    if (pVVar3 == (VARR_node_t *)0x0) goto LAB_001acbdf;
    uVar9 = pVVar3->els_num;
    uVar14 = 0;
    goto LAB_001acbb3;
  case TM_ARR:
    if (name->varr != (char *)0x0) break;
    goto LAB_001ad0ea;
  case TM_FUNC:
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'F';
      get_type_alias_name(c2m_ctx,((type->u).ptr_type)->arr_type,name);
      for (param = (((((type->u).tag_type)->op_link).prev)->u).ops.head;
          param != (node_t_conflict)0x0; param = (param->op_link).next) {
        pdVar11 = get_param_decl_spec(param);
        get_type_alias_name(c2m_ctx,pdVar11->type,name);
      }
      nVar6 = ((type->u).tag_type)->code;
      if (name->varr != (char *)0x0) {
        uVar9 = name->els_num + 1;
        if (name->size < uVar9) {
          sVar15 = (uVar9 >> 1) + uVar9;
          pcVar10 = (char *)realloc(name->varr,sVar15);
          name->varr = pcVar10;
          name->size = sVar15;
        }
        sVar16 = name->els_num;
        name->els_num = sVar16 + 1;
        name->varr[sVar16] = ((nVar6 & N_I) == N_IGNORE) << 5 | 0x45;
        return;
      }
      goto LAB_001ad127;
    }
    goto LAB_001ad122;
  default:
    goto switchD_001acaa6_default;
  }
  uVar9 = name->els_num + 1;
  if (name->size < uVar9) {
    sVar15 = (uVar9 >> 1) + uVar9;
    pcVar10 = (char *)realloc(name->varr,sVar15);
    name->varr = pcVar10;
    name->size = sVar15;
  }
  sVar16 = name->els_num;
  name->els_num = sVar16 + 1;
  name->varr[sVar16] = 'A';
  type = ((type->u).ptr_type)->arr_type;
  goto LAB_001aca8e;
joined_r0x001acdf5:
  if (pnVar13 == (node_t)0x0) {
LAB_001acf24:
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'e';
      return;
    }
  }
  else {
    if (pnVar13->code != N_MEMBER) goto LAB_001acf17;
    pnVar17 = (pnVar13->u).ops.head;
    if (pnVar17 != (node_t)0x0) {
      iVar8 = -2;
      do {
        pnVar17 = (pnVar17->op_link).next;
        if (pnVar17 == (node_t)0x0) break;
        bVar18 = iVar8 != 0;
        iVar8 = iVar8 + 1;
      } while (bVar18);
    }
    get_type_alias_name(c2m_ctx,*(type **)((long)pnVar13->attr + 0x40),name);
    if ((pnVar17->code == N_IGNORE) || (pbVar5 = (byte *)pnVar17->attr, (*pbVar5 & 1) == 0))
    goto LAB_001acf17;
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'w';
      push_val(name,*(mir_long *)(pbVar5 + 0x30));
      uVar9 = *(ulong *)(pbVar5 + 0x30);
      do {
        if (name->varr == (char *)0x0) {
          get_type_alias_name_cold_6();
          goto LAB_001ad0e0;
        }
        uVar14 = name->els_num + 1;
        if (name->size < uVar14) {
          sVar15 = (uVar14 >> 1) + uVar14;
          pcVar10 = (char *)realloc(name->varr,sVar15);
          name->varr = pcVar10;
          name->size = sVar15;
        }
        sVar16 = name->els_num;
        name->els_num = sVar16 + 1;
        name->varr[sVar16] = (char)uVar9 + (char)(uVar9 / 10) * -10 | 0x30;
        bVar18 = 9 < uVar9;
        uVar9 = uVar9 / 10;
      } while (bVar18);
      goto LAB_001acf17;
    }
    get_type_alias_name_cold_7();
LAB_001ad113:
    get_type_alias_name_cold_11();
  }
  goto LAB_001ad118;
LAB_001acf17:
  pnVar13 = (pnVar13->op_link).next;
  goto joined_r0x001acdf5;
LAB_001acbb3:
  do {
    if (uVar9 == uVar14) {
LAB_001acd91:
      if (pVVar3->varr == (node_t_conflict *)0x0) goto LAB_001ad11d;
      aVar4 = type->u;
      uVar9 = uVar9 + 1;
      if (pVVar3->size < uVar9) {
        sVar16 = (uVar9 >> 1) + uVar9;
        ppnVar12 = (node_t_conflict *)realloc(pVVar3->varr,sVar16 * 8);
        pVVar3->varr = ppnVar12;
        pVVar3->size = sVar16;
      }
      sVar16 = pVVar3->els_num;
      pVVar3->els_num = sVar16 + 1;
      *(anon_union_8_5_3fbb1736_for_u *)(pVVar3->varr + sVar16) = aVar4;
      pnVar13 = (((type->u).tag_type)->u).ops.head;
      if (pnVar13 != (node_t)0x0) {
        pnVar13 = (pnVar13->op_link).next;
      }
      pnVar13 = (pnVar13->u).ops.head;
      goto joined_r0x001acdf5;
    }
    if (pVVar3->varr == (node_t_conflict *)0x0) {
LAB_001ad0e0:
      get_type_alias_name_cold_5();
LAB_001ad0e5:
      get_type_alias_name_cold_12();
LAB_001ad0ea:
      get_type_alias_name_cold_3();
switchD_001acaa6_default:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x28a7,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
    }
    if (pVVar3->varr[uVar14] == (type->u).tag_type) {
      if (uVar9 <= uVar14) goto LAB_001acd91;
      if (name->varr == (char *)0x0) goto LAB_001ad12c;
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'r';
      push_val(name,uVar14);
      goto LAB_001acf24;
    }
    uVar14 = uVar14 + 1;
  } while (pVVar3 != (VARR_node_t *)0x0);
LAB_001acbdf:
  get_type_alias_name_cold_10();
switchD_001acaa6_caseD_1:
  bVar7 = (type->u).basic_type;
LAB_001acbf2:
  switch(bVar7) {
  case TP_VOID:
    obj = 'v';
    break;
  case TP_BOOL:
    obj = 'b';
    break;
  case TP_CHAR:
  case TP_SCHAR:
  case TP_UCHAR:
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'c';
      return;
    }
    goto LAB_001ad131;
  case TP_SHORT:
  case TP_USHORT:
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 's';
      return;
    }
    goto LAB_001ad136;
  case TP_INT:
  case TP_UINT:
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'i';
      return;
    }
    goto LAB_001ad140;
  case TP_LONG:
  case TP_ULONG:
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'l';
      return;
    }
    goto LAB_001ad145;
  case TP_LLONG:
  case TP_ULLONG:
    if (name->varr != (char *)0x0) {
      uVar9 = name->els_num + 1;
      if (name->size < uVar9) {
        sVar15 = (uVar9 >> 1) + uVar9;
        pcVar10 = (char *)realloc(name->varr,sVar15);
        name->varr = pcVar10;
        name->size = sVar15;
      }
      sVar16 = name->els_num;
      name->els_num = sVar16 + 1;
      name->varr[sVar16] = 'L';
      return;
    }
    goto LAB_001ad13b;
  case TP_FLOAT:
    obj = 'f';
    break;
  case TP_DOUBLE:
    obj = 'd';
    break;
  case TP_LDOUBLE:
    obj = 'D';
    break;
  default:
    goto switchD_001acc0b_default;
  }
  VARR_charpush(name,obj);
  return;
LAB_001ad118:
  get_type_alias_name_cold_8();
LAB_001ad11d:
  get_type_alias_name_cold_9();
LAB_001ad122:
  get_type_alias_name_cold_2();
LAB_001ad127:
  get_type_alias_name_cold_1();
LAB_001ad12c:
  get_type_alias_name_cold_4();
LAB_001ad131:
  get_type_alias_name_cold_17();
LAB_001ad136:
  get_type_alias_name_cold_16();
LAB_001ad13b:
  get_type_alias_name_cold_13();
LAB_001ad140:
  get_type_alias_name_cold_15();
LAB_001ad145:
  get_type_alias_name_cold_14();
switchD_001acc0b_default:
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2874,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
}

Assistant:

static void get_type_alias_name (c2m_ctx_t c2m_ctx, struct type *type, VARR (char) * name) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  enum basic_type basic_type;
  size_t i;

  switch (type->mode) {
  case TM_ENUM: basic_type = get_enum_basic_type (type); goto basic;
  case TM_BASIC:
    basic_type = type->u.basic_type;
  basic:
    switch (basic_type) {
    case TP_VOID: VARR_PUSH (char, name, 'v'); break;
    case TP_BOOL: VARR_PUSH (char, name, 'b'); break;
    case TP_CHAR:
    case TP_SCHAR:
    case TP_UCHAR: VARR_PUSH (char, name, 'c'); break;
    case TP_SHORT:
    case TP_USHORT: VARR_PUSH (char, name, 's'); break;
    case TP_INT:
    case TP_UINT: VARR_PUSH (char, name, 'i'); break;
    case TP_LONG:
    case TP_ULONG: VARR_PUSH (char, name, 'l'); break;
    case TP_LLONG:
    case TP_ULLONG: VARR_PUSH (char, name, 'L'); break;
    case TP_FLOAT: VARR_PUSH (char, name, 'f'); break;
    case TP_DOUBLE: VARR_PUSH (char, name, 'd'); break;
    case TP_LDOUBLE: VARR_PUSH (char, name, 'D'); break;
    default: assert (FALSE);
    }
    break;
  case TM_PTR:
    VARR_PUSH (char, name, 'p');
    get_type_alias_name (c2m_ctx, type->u.ptr_type, name);
    break;
  case TM_STRUCT:
  case TM_UNION:
    VARR_PUSH (char, name, type->mode == TM_STRUCT ? 'S' : 'U');
    for (i = 0; i < VARR_LENGTH (node_t, node_stack); i++)
      if (VARR_GET (node_t, node_stack, i) == type->u.tag_type) break;
    if (i < VARR_LENGTH (node_t, node_stack)) {
      VARR_PUSH (char, name, 'r');
      push_val (name, (mir_long) i);
    } else {
      VARR_PUSH (node_t, node_stack, type->u.tag_type);
      for (node_t member = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); member != NULL;
           member = NL_NEXT (member))
        if (member->code == N_MEMBER) {
          decl_t decl = member->attr;
          node_t width = NL_EL (member->u.ops, 3);
          struct expr *expr;

          get_type_alias_name (c2m_ctx, decl->decl_spec.type, name);
          if (width->code != N_IGNORE && (expr = width->attr)->const_p) {
            VARR_PUSH (char, name, 'w');
            push_val (name, (mir_long) expr->c.u_val);
            for (mir_ullong v = expr->c.u_val;;) {
              VARR_PUSH (char, name, v % 10 + '0');
              v /= 10;
              if (v == 0) break;
            }
          }
        }
    }
    VARR_PUSH (char, name, 'e');
    break;
  case TM_ARR:
    VARR_PUSH (char, name, 'A');
    get_type_alias_name (c2m_ctx, type->u.arr_type->el_type, name);
    break;
  case TM_FUNC:
    VARR_PUSH (char, name, 'F');
    get_type_alias_name (c2m_ctx, type->u.func_type->ret_type, name);
    for (node_t p = NL_HEAD (type->u.func_type->param_list->u.ops); p != NULL; p = NL_NEXT (p)) {
      struct decl_spec *ds = get_param_decl_spec (p);
      get_type_alias_name (c2m_ctx, ds->type, name);
    }
    VARR_PUSH (char, name, type->u.func_type->dots_p ? 'E' : 'e');
    break;
  default: assert (FALSE);
  }
}